

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O1

AllocaInst * __thiscall
dg::vr::ValueRelations::getInstance<llvm::AllocaInst>(ValueRelations *this,Handle h)

{
  VectorSet<const_llvm::Value_*> *pVVar1;
  pointer ppVVar2;
  Value *pVVar3;
  
  pVVar1 = getEqual(this,h);
  ppVVar2 = (pVVar1->vec).
            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (ppVVar2 ==
        (pVVar1->vec).super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      return (AllocaInst *)0x0;
    }
    pVVar3 = *ppVVar2;
    if (pVVar3[0x10] != (Value)0x3a) {
      pVVar3 = (Value *)0x0;
    }
    if (pVVar3 != (Value *)0x0) break;
    ppVVar2 = ppVVar2 + 1;
  }
  return (AllocaInst *)pVVar3;
}

Assistant:

const I *getInstance(Handle h) const {
        for (const auto *val : getEqual(h)) {
            if (const auto *inst = llvm::dyn_cast<I>(val))
                return inst;
        }
        return nullptr;
    }